

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O2

void Assimp::Q3Shader::ConvertShaderToMaterial(aiMaterial *out,ShaderDataBlock *shader)

{
  aiMaterial *this;
  _List_node_base *p_Var1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint type;
  size_t __n;
  uint index;
  _List_node_base *p_Var5;
  uint local_468;
  uint local_464;
  uint local_460;
  int use_alpha;
  aiMaterial *local_458;
  ulong local_450;
  ulong local_448;
  _List_node_base *local_440;
  int twosided;
  undefined1 auStack_434 [4];
  ai_real local_430;
  
  if (out == (aiMaterial *)0x0) {
    __assert_fail("__null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MD3/MD3Loader.cpp"
                  ,0x113,
                  "void Assimp::Q3Shader::ConvertShaderToMaterial(aiMaterial *, const ShaderDataBlock &)"
                 );
  }
  if (shader->cull == CULL_NONE) {
    twosided = 1;
    aiMaterial::AddProperty(out,&twosided,1,"$mat.twosided",0,0);
  }
  p_Var5 = (_List_node_base *)&shader->maps;
  uVar2 = 0;
  local_464 = 0;
  uVar4 = 0;
  local_458 = out;
  local_440 = p_Var5;
  do {
    p_Var1 = local_440;
    p_Var5 = (((_List_base<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == local_440) {
      if ((int)uVar2 != 0) {
        twosided = 0x3f800000;
        auStack_434[0] = '\0';
        auStack_434[1] = '\0';
        auStack_434[2] = -0x80;
        auStack_434[3] = '?';
        local_430 = 1.0;
        aiMaterial::AddProperty(local_458,(aiColor3D *)&twosided,1,"$clr.emissive",0,0);
      }
      return;
    }
    __n = (ulong)p_Var5[1]._M_prev & 0xffffffff;
    if (((ulong)p_Var5[1]._M_prev & 0xfffffc00) != 0) {
      __n = 0x3ff;
    }
    twosided = (ai_uint32)__n;
    local_450 = uVar4;
    local_448 = uVar2;
    memcpy(auStack_434,p_Var5[1]._M_next,__n);
    this = local_458;
    auStack_434[__n] = 0;
    local_460 = (uint)local_448;
    uVar3 = (uint)local_450;
    if (*(int *)&p_Var5[3]._M_next == 3) {
      if (*(int *)((long)&p_Var5[3]._M_next + 4) != 2) goto LAB_0042cf4b;
      local_468 = uVar3 + 1;
      type = 10;
      index = uVar3;
    }
    else {
      if ((*(int *)&p_Var5[3]._M_next == 1) && (*(int *)((long)&p_Var5[3]._M_next + 4) == 1)) {
        if (p_Var5 != p_Var1->_M_next) {
          type = 4;
          index = local_460;
          local_468 = uVar3;
          local_460 = local_460 + 1;
          goto LAB_0042cf8f;
        }
        use_alpha = 1;
      }
      else {
LAB_0042cf4b:
        use_alpha = 0;
      }
      aiMaterial::AddProperty(local_458,&use_alpha,1,"$mat.blend",0,0);
      index = local_464;
      type = 1;
      local_468 = (uint)local_450;
      local_464 = local_464 + 1;
      local_460 = (uint)local_448;
    }
LAB_0042cf8f:
    aiMaterial::AddProperty(this,(aiString *)&twosided,"$tex.file",type,index);
    use_alpha = (uint)(*(int *)&p_Var5[3]._M_prev == 0) * 2 + 2;
    aiMaterial::AddProperty(this,&use_alpha,1,"$tex.flags",type,index);
    uVar2 = (ulong)local_460;
    uVar4 = (ulong)local_468;
  } while( true );
}

Assistant:

void Q3Shader::ConvertShaderToMaterial(aiMaterial* out, const ShaderDataBlock& shader)
{
    ai_assert(NULL != out);

    /*  IMPORTANT: This is not a real conversion. Actually we're just guessing and
     *  hacking around to build an aiMaterial that looks nearly equal to the
     *  original Quake 3 shader. We're missing some important features like
     *  animatable material properties in our material system, but at least
     *  multiple textures should be handled correctly.
     */

    // Two-sided material?
    if (shader.cull == Q3Shader::CULL_NONE) {
        const int twosided = 1;
        out->AddProperty(&twosided,1,AI_MATKEY_TWOSIDED);
    }

    unsigned int cur_emissive = 0, cur_diffuse = 0, cur_lm =0;

    // Iterate through all textures
    for (std::list< Q3Shader::ShaderMapBlock >::const_iterator it = shader.maps.begin(); it != shader.maps.end();++it) {

        // CONVERSION BEHAVIOUR:
        //
        //
        // If the texture is additive
        //  - if it is the first texture, assume additive blending for the whole material
        //  - otherwise register it as emissive texture.
        //
        // If the texture is using standard blend (or if the blend mode is unknown)
        //  - if first texture: assume default blending for material
        //  - in any case: set it as diffuse texture
        //
        // If the texture is using 'filter' blending
        //  - take as lightmap
        //
        // Textures with alpha funcs
        //  - aiTextureFlags_UseAlpha is set (otherwise aiTextureFlags_NoAlpha is explicitly set)
        aiString s((*it).name);
        aiTextureType type; unsigned int index;

        if ((*it).blend_src == Q3Shader::BLEND_GL_ONE && (*it).blend_dest == Q3Shader::BLEND_GL_ONE) {
            if (it == shader.maps.begin()) {
                const int additive = aiBlendMode_Additive;
                out->AddProperty(&additive,1,AI_MATKEY_BLEND_FUNC);

                index = cur_diffuse++;
                type  = aiTextureType_DIFFUSE;
            }
            else {
                index = cur_emissive++;
                type  = aiTextureType_EMISSIVE;
            }
        }
        else if ((*it).blend_src == Q3Shader::BLEND_GL_DST_COLOR && (*it).blend_dest == Q3Shader::BLEND_GL_ZERO) {
            index = cur_lm++;
            type  = aiTextureType_LIGHTMAP;
        }
        else {
            const int blend = aiBlendMode_Default;
            out->AddProperty(&blend,1,AI_MATKEY_BLEND_FUNC);

            index = cur_diffuse++;
            type  = aiTextureType_DIFFUSE;
        }

        // setup texture
        out->AddProperty(&s,AI_MATKEY_TEXTURE(type,index));

        // setup texture flags
        const int use_alpha = ((*it).alpha_test != Q3Shader::AT_NONE ? aiTextureFlags_UseAlpha : aiTextureFlags_IgnoreAlpha);
        out->AddProperty(&use_alpha,1,AI_MATKEY_TEXFLAGS(type,index));
    }
    // If at least one emissive texture was set, set the emissive base color to 1 to ensure
    // the texture is actually displayed.
    if (0 != cur_emissive) {
        aiColor3D one(1.f,1.f,1.f);
        out->AddProperty(&one,1,AI_MATKEY_COLOR_EMISSIVE);
    }
}